

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int exp_check_token(lyxp_expr *exp,uint16_t exp_idx,lyxp_token want_tok,int strict)

{
  char *pcVar1;
  int strict_local;
  lyxp_token want_tok_local;
  uint16_t exp_idx_local;
  lyxp_expr *exp_local;
  
  if (exp->used == exp_idx) {
    if (strict != 0) {
      ly_vlog(LYE_XPATH_EOF,LY_VLOG_NONE,(void *)0x0);
    }
    exp_local._4_4_ = -1;
  }
  else if ((want_tok == LYXP_TOKEN_NONE) || (exp->tokens[exp_idx] == want_tok)) {
    exp_local._4_4_ = 0;
  }
  else {
    if (strict != 0) {
      pcVar1 = print_token(exp->tokens[exp_idx]);
      ly_vlog(LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,pcVar1,exp->expr + exp->expr_pos[exp_idx]);
    }
    exp_local._4_4_ = -1;
  }
  return exp_local._4_4_;
}

Assistant:

static int
exp_check_token(struct lyxp_expr *exp, uint16_t exp_idx, enum lyxp_token want_tok, int strict)
{
    if (exp->used == exp_idx) {
        if (strict) {
            LOGVAL(LYE_XPATH_EOF, LY_VLOG_NONE, NULL);
        }
        return -1;
    }

    if (want_tok && (exp->tokens[exp_idx] != want_tok)) {
        if (strict) {
            LOGVAL(LYE_XPATH_INTOK, LY_VLOG_NONE, NULL,
                   print_token(exp->tokens[exp_idx]), &exp->expr[exp->expr_pos[exp_idx]]);
        }
        return -1;
    }

    return EXIT_SUCCESS;
}